

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvPostProcess.cpp
# Opt level: O1

void __thiscall spv::Builder::postProcessFeatures(Builder *this)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  Id resultId;
  Instruction *pIVar2;
  int *piVar3;
  Block *pBVar4;
  __uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_> this_01;
  bool bVar5;
  Id typeId;
  int iVar6;
  mapped_type *pmVar7;
  pointer ppFVar8;
  _Rb_tree_node_base *p_Var9;
  _Base_ptr p_Var10;
  pointer ppBVar11;
  _Base_ptr p_Var12;
  _Rb_tree_header *p_Var13;
  pointer puVar14;
  bool bVar15;
  long lVar16;
  ulong uVar17;
  vector<unsigned_int,_std::allocator<unsigned_int>_> workgroup_variables;
  Id id;
  uint *local_68;
  iterator iStack_60;
  uint *local_58;
  Id local_4c;
  pointer local_48;
  Function *local_40;
  pointer local_38;
  
  this_00 = &this->groupedTypes;
  local_68 = (uint *)CONCAT44(local_68._4_4_,0x20);
  pmVar7 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&local_68);
  if (0 < (int)((ulong)((long)(pmVar7->
                              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar7->
                             super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar16 = 0;
    do {
      local_68 = (uint *)CONCAT44(local_68._4_4_,0x20);
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_68);
      pIVar2 = (pmVar7->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>)
               ._M_impl.super__Vector_impl_data._M_start[lVar16];
      uVar17 = **(ulong **)
                 &(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data;
      if ((uVar17 & 1) != 0) goto LAB_0046e377;
      piVar3 = *(int **)&(pIVar2->operands).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data;
      if (*piVar3 == 0x14e5) {
        if ((uVar17 & 2) == 0) {
LAB_0046e358:
          __assert_fail("idOperand[op]",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                        ,0xa1,"Id spv::Instruction::getIdOperand(int) const");
        }
        bVar5 = containsType(this,piVar3[1],OpTypeInt,8);
        if (bVar5) {
          if (this->spvVersion < 0x10500) {
            addExtension(this,"SPV_KHR_8bit_storage");
          }
          local_68 = (uint *)CONCAT44(local_68._4_4_,0x1160);
          std::
          _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
          ::_M_insert_unique<spv::Capability_const&>
                    ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                      *)&this->capabilities,(Capability *)&local_68);
        }
        if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data & 2) == 0) goto LAB_0046e358;
        bVar5 = containsType(this,*(Id *)(*(long *)&(pIVar2->operands).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + 4),OpTypeInt,
                             0x10);
        if (!bVar5) {
          if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data & 2) == 0) goto LAB_0046e358;
          bVar5 = containsType(this,*(Id *)(*(long *)&(pIVar2->operands).
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data + 4),OpTypeFloat,
                               0x10);
          if (!bVar5) goto LAB_0046dfd3;
        }
        if (this->spvVersion < 0x10300) {
          addExtension(this,"SPV_KHR_16bit_storage");
        }
        local_68 = (uint *)CONCAT44(local_68._4_4_,0x1151);
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,std::allocator<spv::Capability>>
                    *)&this->capabilities,(Capability *)&local_68);
      }
LAB_0046dfd3:
      lVar16 = lVar16 + 1;
      local_68 = (uint *)CONCAT44(local_68._4_4_,0x20);
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_68);
    } while (lVar16 < (int)((ulong)((long)(pmVar7->
                                          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pmVar7->
                                         super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  ppFVar8 = (this->module).functions.
            super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppFVar8 !=
      (this->module).functions.super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var1 = &(this->decorations)._M_t._M_impl.super__Rb_tree_header;
    do {
      local_40 = *ppFVar8;
      ppBVar11 = (local_40->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_48 = ppFVar8;
      while (ppBVar11 !=
             (local_40->blocks).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        pBVar4 = *ppBVar11;
        local_38 = ppBVar11;
        for (puVar14 = (pBVar4->instructions).
                       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            puVar14 !=
            (pBVar4->instructions).
            super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; puVar14 = puVar14 + 1) {
          postProcess(this,(puVar14->_M_t).
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
        }
        for (puVar14 = (pBVar4->localVariables).
                       super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            puVar14 !=
            (pBVar4->localVariables).
            super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; puVar14 = puVar14 + 1) {
          resultId = ((puVar14->_M_t).
                      super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                      .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->resultId;
          typeId = getDerefTypeId(this,resultId);
          bVar5 = containsPhysicalStorageBufferOrArray(this,typeId);
          if (bVar5) {
            p_Var9 = (this->decorations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            if ((_Rb_tree_header *)p_Var9 != p_Var1) {
              bVar15 = false;
              bVar5 = false;
              do {
                lVar16 = *(long *)(p_Var9 + 1);
                if ((**(ulong **)(lVar16 + 0x30) & 1) == 0) goto LAB_0046e358;
                if ((**(Id **)(lVar16 + 0x18) == resultId) && (*(int *)(lVar16 + 0x10) == 0x47)) {
                  if ((**(ulong **)(lVar16 + 0x30) & 2) != 0) goto LAB_0046e377;
                  bVar5 = bVar15;
                  if ((*(Id **)(lVar16 + 0x18))[1] - 0x14eb < 2) {
                    bVar15 = true;
                    bVar5 = true;
                  }
                }
                p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
              } while ((_Rb_tree_header *)p_Var9 != p_Var1);
              if (bVar5) goto LAB_0046e115;
            }
            addDecoration(this,resultId,AliasedPointer,-1);
          }
LAB_0046e115:
        }
        ppBVar11 = local_38 + 1;
      }
      ppFVar8 = local_48 + 1;
    } while (ppFVar8 !=
             (this->module).functions.
             super__Vector_base<spv::Function_*,_std::allocator<spv::Function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  p_Var1 = &(this->capabilities)._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var10 = &p_Var1->_M_header;
  for (; p_Var12 != (_Base_ptr)0x0; p_Var12 = (&p_Var12->_M_left)[(int)p_Var12[1]._M_color < 0x14e1]
      ) {
    if (0x14e0 < (int)p_Var12[1]._M_color) {
      p_Var10 = p_Var12;
    }
  }
  p_Var12 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
     (p_Var12 = p_Var10, 0x14e1 < (int)p_Var10[1]._M_color)) {
    p_Var12 = &p_Var1->_M_header;
  }
  if (((_Rb_tree_header *)p_Var12 != p_Var1) &&
     (this->memoryModel = MemoryModelVulkan, this->spvVersion < 0x10500)) {
    addExtension(this,"SPV_KHR_vulkan_memory_model");
  }
  p_Var12 = (this->capabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var10 = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)p_Var12 != (_Rb_tree_header *)0x0;
      p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < 0x114c]) {
    if (0x114b < (int)*(size_t *)(p_Var12 + 1)) {
      p_Var10 = p_Var12;
    }
  }
  p_Var13 = p_Var1;
  if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
     (p_Var13 = (_Rb_tree_header *)p_Var10,
     0x114c < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
    p_Var13 = p_Var1;
  }
  if (p_Var13 != p_Var1) {
    puVar14 = (this->entryPoints).
              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)(this->entryPoints).
              super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar14 != 8) {
      __assert_fail("entryPoints.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvPostProcess.cpp"
                    ,0x1d0,"void spv::Builder::postProcessFeatures()");
    }
    local_68 = (uint *)0x0;
    iStack_60._M_current = (uint *)0x0;
    local_58 = (uint *)0x0;
    iVar6 = Instruction::getNumOperands
                      ((Instruction *)
                       (puVar14->_M_t).
                       super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                       ._M_t);
    if (0 < iVar6) {
      uVar17 = 0;
      do {
        this_01._M_t.
        super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
        super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl =
             (puVar14->_M_t).
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t;
        if ((*(ulong *)(*(long *)&(((vector<bool,_std::allocator<bool>_> *)
                                   ((long)this_01._M_t.
                                          super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                          .super__Head_base<0UL,_spv::Instruction_*,_false>.
                                          _M_head_impl + 0x30))->
                                  super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                  super__Bvector_impl_data + (uVar17 >> 6) * 8) >> (uVar17 & 0x3f) &
            1) != 0) {
          local_4c = Instruction::getIdOperand
                               ((Instruction *)
                                this_01._M_t.
                                super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                                .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl,
                                (int)uVar17);
          pIVar2 = (this->module).idToInstruction.
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[local_4c];
          if (pIVar2->opCode == OpVariable) {
            if ((**(byte **)&(pIVar2->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data & 1) != 0) {
LAB_0046e377:
              __assert_fail("!idOperand[op]",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                            ,0xa5,"unsigned int spv::Instruction::getImmediateOperand(int) const");
            }
            if (**(int **)&(pIVar2->operands).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data == 4) {
              if (iStack_60._M_current == local_58) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                           &local_4c);
              }
              else {
                *iStack_60._M_current = local_4c;
                iStack_60._M_current = iStack_60._M_current + 1;
              }
            }
          }
        }
        uVar17 = uVar17 + 1;
        iVar6 = Instruction::getNumOperands
                          ((Instruction *)
                           (puVar14->_M_t).
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t);
      } while ((long)uVar17 < (long)iVar6);
    }
    if ((4 < (ulong)((long)iStack_60._M_current - (long)local_68)) &&
       (iStack_60._M_current != local_68)) {
      uVar17 = 0;
      do {
        addDecoration(this,local_68[uVar17],Aliased,-1);
        uVar17 = uVar17 + 1;
      } while (uVar17 < (ulong)((long)iStack_60._M_current - (long)local_68 >> 2));
    }
    if (local_68 != (uint *)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  return;
}

Assistant:

void Builder::postProcessFeatures() {
    // Add per-instruction capabilities, extensions, etc.,

    // Look for any 8/16 bit type in physical storage buffer class, and set the
    // appropriate capability. This happens in createSpvVariable for other storage
    // classes, but there isn't always a variable for physical storage buffer.
    for (int t = 0; t < (int)groupedTypes[OpTypePointer].size(); ++t) {
        Instruction* type = groupedTypes[OpTypePointer][t];
        if (type->getImmediateOperand(0) == (unsigned)StorageClassPhysicalStorageBufferEXT) {
            if (containsType(type->getIdOperand(1), OpTypeInt, 8)) {
                addIncorporatedExtension(spv::E_SPV_KHR_8bit_storage, spv::Spv_1_5);
                addCapability(spv::CapabilityStorageBuffer8BitAccess);
            }
            if (containsType(type->getIdOperand(1), OpTypeInt, 16) ||
                containsType(type->getIdOperand(1), OpTypeFloat, 16)) {
                addIncorporatedExtension(spv::E_SPV_KHR_16bit_storage, spv::Spv_1_3);
                addCapability(spv::CapabilityStorageBuffer16BitAccess);
            }
        }
    }

    // process all block-contained instructions
    for (auto fi = module.getFunctions().cbegin(); fi != module.getFunctions().cend(); fi++) {
        Function* f = *fi;
        for (auto bi = f->getBlocks().cbegin(); bi != f->getBlocks().cend(); bi++) {
            Block* b = *bi;
            for (auto ii = b->getInstructions().cbegin(); ii != b->getInstructions().cend(); ii++)
                postProcess(*ii->get());

            // For all local variables that contain pointers to PhysicalStorageBufferEXT, check whether
            // there is an existing restrict/aliased decoration. If we don't find one, add Aliased as the
            // default.
            for (auto vi = b->getLocalVariables().cbegin(); vi != b->getLocalVariables().cend(); vi++) {
                const Instruction& inst = *vi->get();
                Id resultId = inst.getResultId();
                if (containsPhysicalStorageBufferOrArray(getDerefTypeId(resultId))) {
                    bool foundDecoration = false;
                    const auto function = [&](const std::unique_ptr<Instruction>& decoration) {
                        if (decoration.get()->getIdOperand(0) == resultId &&
                            decoration.get()->getOpCode() == OpDecorate &&
                            (decoration.get()->getImmediateOperand(1) == spv::DecorationAliasedPointerEXT ||
                             decoration.get()->getImmediateOperand(1) == spv::DecorationRestrictPointerEXT)) {
                            foundDecoration = true;
                        }
                    };
                    std::for_each(decorations.begin(), decorations.end(), function);
                    if (!foundDecoration) {
                        addDecoration(resultId, spv::DecorationAliasedPointerEXT);
                    }
                }
            }
        }
    }

    // If any Vulkan memory model-specific functionality is used, update the
    // OpMemoryModel to match.
    if (capabilities.find(spv::CapabilityVulkanMemoryModelKHR) != capabilities.end()) {
        memoryModel = spv::MemoryModelVulkanKHR;
        addIncorporatedExtension(spv::E_SPV_KHR_vulkan_memory_model, spv::Spv_1_5);
    }

    // Add Aliased decoration if there's more than one Workgroup Block variable.
    if (capabilities.find(spv::CapabilityWorkgroupMemoryExplicitLayoutKHR) != capabilities.end()) {
        assert(entryPoints.size() == 1);
        auto &ep = entryPoints[0];

        std::vector<Id> workgroup_variables;
        for (int i = 0; i < (int)ep->getNumOperands(); i++) {
            if (!ep->isIdOperand(i))
                continue;

            const Id id = ep->getIdOperand(i);
            const Instruction *instr = module.getInstruction(id);
            if (instr->getOpCode() != spv::OpVariable)
                continue;

            if (instr->getImmediateOperand(0) == spv::StorageClassWorkgroup)
                workgroup_variables.push_back(id);
        }

        if (workgroup_variables.size() > 1) {
            for (size_t i = 0; i < workgroup_variables.size(); i++)
                addDecoration(workgroup_variables[i], spv::DecorationAliased);
        }
    }
}